

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<13>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  uint *puVar1;
  CodedOutputStream *output_local;
  void *ptr_local;
  
  puVar1 = Get<unsigned_int>(ptr);
  WireFormatLite::WriteUInt32NoTag(*puVar1,output);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteUInt32NoTag(Get<uint32_t>(ptr), output);
  }